

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O1

shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> __thiscall
juzzlin::Argengine::Impl::addOptionCommon<std::function<void(std::__cxx11::string)>>
          (Impl *this,OptionSet *optionVariants,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,bool required,string *infoText)

{
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *optionDefinition;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> sVar2;
  OptionDefinitionSP existing;
  bool local_42;
  undefined1 local_41;
  OptionDefinition *local_40;
  pointer local_38;
  
  local_42 = SUB81(infoText,0);
  getOptionDefinition((Impl *)&stack0xffffffffffffffc0,optionVariants);
  if (local_40 == (OptionDefinition *)0x0) {
    (this->m_args).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<juzzlin::Argengine::Impl::OptionDefinition,std::allocator<juzzlin::Argengine::Impl::OptionDefinition>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,std::function<void(std::__cxx11::string)>&,bool&,std::__cxx11::string_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->m_args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,(OptionDefinition **)this,
               (allocator<juzzlin::Argengine::Impl::OptionDefinition> *)&local_41,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)callback,
               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)CONCAT71(in_register_00000009,required),&local_42,in_R9);
    std::
    vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
    ::push_back((vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
                 *)&optionVariants[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                (value_type *)this);
    _Var1._M_pi = extraout_RDX;
    if (local_38 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      _Var1._M_pi = extraout_RDX_00;
    }
    sVar2.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var1._M_pi;
    sVar2.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>)
           sVar2.
           super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  throwOptionExistingError((Impl *)optionVariants,local_40);
}

Assistant:

std::shared_ptr<OptionDefinition> addOptionCommon(const OptionSet & optionVariants, CallbackType callback, bool required, const std::string & infoText)
    {
        if (const auto existing = getOptionDefinition(optionVariants)) {
            throwOptionExistingError(*existing);
        } else {
            const auto optionDefinition = std::make_shared<OptionDefinition>(optionVariants, callback, required, infoText);
            m_optionDefinitions.push_back(optionDefinition);
            return optionDefinition;
        }
    }